

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_sqrt(void)

{
  int iVar1;
  int j;
  int i;
  secp256k1_fe t;
  secp256k1_fe s;
  secp256k1_fe x;
  secp256k1_fe ns;
  undefined4 in_stack_ffffffffffffff38;
  int iVar2;
  int in_stack_ffffffffffffff3c;
  int iVar3;
  secp256k1_fe *in_stack_ffffffffffffff40;
  secp256k1_fe *in_stack_ffffffffffffff50;
  secp256k1_fe *in_stack_ffffffffffffff60;
  secp256k1_fe *in_stack_ffffffffffffff98;
  secp256k1_fe *in_stack_ffffffffffffffa0;
  
  secp256k1_fe_set_int(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  secp256k1_fe_sqr(in_stack_ffffffffffffff40,
                   (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  test_sqrt(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  for (iVar3 = 1; iVar3 < 0x65; iVar3 = iVar3 + 1) {
    secp256k1_fe_set_int(in_stack_ffffffffffffff40,iVar3);
    secp256k1_fe_sqr(in_stack_ffffffffffffff40,
                     (secp256k1_fe *)CONCAT44(iVar3,in_stack_ffffffffffffff38));
    test_sqrt(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    secp256k1_fe_negate_unchecked
              (in_stack_ffffffffffffff40,(secp256k1_fe *)CONCAT44(iVar3,in_stack_ffffffffffffff38),0
              );
    test_sqrt(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  iVar3 = 0;
  do {
    if (9 < iVar3) {
      return;
    }
    random_fe_non_square(in_stack_ffffffffffffff60);
    for (iVar2 = 0; iVar2 < COUNT; iVar2 = iVar2 + 1) {
      random_fe(in_stack_ffffffffffffff50);
      secp256k1_fe_sqr(in_stack_ffffffffffffff40,(secp256k1_fe *)CONCAT44(iVar3,iVar2));
      iVar1 = secp256k1_fe_is_square_var(in_stack_ffffffffffffffa0);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0xd55,"test condition failed: secp256k1_fe_is_square_var(&s)");
        abort();
      }
      test_sqrt(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      secp256k1_fe_negate_unchecked
                (in_stack_ffffffffffffff40,(secp256k1_fe *)CONCAT44(iVar3,iVar2),0);
      iVar1 = secp256k1_fe_is_square_var(in_stack_ffffffffffffffa0);
      if (iVar1 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0xd58,"test condition failed: !secp256k1_fe_is_square_var(&t)");
        abort();
      }
      test_sqrt(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      secp256k1_fe_mul(in_stack_ffffffffffffff40,(secp256k1_fe *)CONCAT44(iVar3,iVar2),
                       (secp256k1_fe *)0x11683c);
      test_sqrt(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

static void run_sqrt(void) {
    secp256k1_fe ns, x, s, t;
    int i;

    /* Check sqrt(0) is 0 */
    secp256k1_fe_set_int(&x, 0);
    secp256k1_fe_sqr(&s, &x);
    test_sqrt(&s, &x);

    /* Check sqrt of small squares (and their negatives) */
    for (i = 1; i <= 100; i++) {
        secp256k1_fe_set_int(&x, i);
        secp256k1_fe_sqr(&s, &x);
        test_sqrt(&s, &x);
        secp256k1_fe_negate(&t, &s, 1);
        test_sqrt(&t, NULL);
    }

    /* Consistency checks for large random values */
    for (i = 0; i < 10; i++) {
        int j;
        random_fe_non_square(&ns);
        for (j = 0; j < COUNT; j++) {
            random_fe(&x);
            secp256k1_fe_sqr(&s, &x);
            CHECK(secp256k1_fe_is_square_var(&s));
            test_sqrt(&s, &x);
            secp256k1_fe_negate(&t, &s, 1);
            CHECK(!secp256k1_fe_is_square_var(&t));
            test_sqrt(&t, NULL);
            secp256k1_fe_mul(&t, &s, &ns);
            test_sqrt(&t, NULL);
        }
    }
}